

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::geometry::anon_unknown_2::TriangleStripAdjacencyVertexCountTest::createInstance
          (TriangleStripAdjacencyVertexCountTest *this,Context *context)

{
  VkPrimitiveTopology primitiveType;
  TestInstance *this_00;
  char *name;
  Context *context_local;
  TriangleStripAdjacencyVertexCountTest *this_local;
  
  this_00 = (TestInstance *)operator_new(0x70);
  primitiveType = (this->super_GeometryExpanderRenderTest).m_primitiveType;
  name = tcu::TestNode::getName((TestNode *)this);
  GeometryInputTestInstance::GeometryInputTestInstance
            ((GeometryInputTestInstance *)this_00,context,primitiveType,name,
             this->m_numInputVertices);
  return this_00;
}

Assistant:

TestInstance* TriangleStripAdjacencyVertexCountTest::createInstance (Context& context) const
{
	return new GeometryInputTestInstance(context, m_primitiveType, getName(), m_numInputVertices);
}